

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O0

coda_product_type * coda_product_type_new(char *name)

{
  char *pcVar1;
  hashtable *phVar2;
  coda_product_type *product_type;
  char *name_local;
  
  name_local = (char *)malloc(0x30);
  if ((coda_product_type *)name_local == (coda_product_type *)0x0) {
    coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x30,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition.c"
                   ,0x1e2);
    name_local = (char *)0x0;
  }
  else {
    ((coda_product_type *)name_local)->name = (char *)0x0;
    ((coda_product_type *)name_local)->description = (char *)0x0;
    ((coda_product_type *)name_local)->num_product_definitions = 0;
    ((coda_product_type *)name_local)->hash_data = (hashtable *)0x0;
    ((coda_product_type *)name_local)->product_definition = (coda_product_definition **)0x0;
    pcVar1 = strdup(name);
    ((coda_product_type *)name_local)->name = pcVar1;
    if (((coda_product_type *)name_local)->name == (char *)0x0) {
      coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition.c"
                     ,0x1ef);
      coda_product_type_delete((coda_product_type *)name_local);
      name_local = (char *)0x0;
    }
    else {
      phVar2 = coda_hashtable_new(1);
      ((coda_product_type *)name_local)->hash_data = phVar2;
      if (((coda_product_type *)name_local)->hash_data == (hashtable *)0x0) {
        coda_set_error(-1,"out of memory (could not create hashtable) (%s:%u)",
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition.c"
                       ,0x1f8);
        coda_product_type_delete((coda_product_type *)name_local);
        name_local = (char *)0x0;
      }
    }
  }
  return (coda_product_type *)name_local;
}

Assistant:

coda_product_type *coda_product_type_new(const char *name)
{
    coda_product_type *product_type;

    product_type = malloc(sizeof(coda_product_type));
    if (product_type == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)sizeof(coda_product_type), __FILE__, __LINE__);
        return NULL;
    }
    product_type->name = NULL;
    product_type->description = NULL;
    product_type->num_product_definitions = 0;
    product_type->hash_data = NULL;
    product_type->product_definition = NULL;

    product_type->name = strdup(name);
    if (product_type->name == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                       __LINE__);
        coda_product_type_delete(product_type);
        return NULL;
    }

    product_type->hash_data = hashtable_new(1);
    if (product_type->hash_data == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not create hashtable) (%s:%u)", __FILE__,
                       __LINE__);
        coda_product_type_delete(product_type);
        return NULL;
    }

    return product_type;
}